

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

string * __thiscall
jsonnet::internal::unparse_id_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,Identifier *id)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar1 = *(long *)(this + 8);
  if (lVar1 != 0) {
    lVar2 = *(long *)this;
    lVar3 = 0;
    do {
      encode_utf8(*(char32_t *)(lVar2 + lVar3),__return_storage_ptr__);
      lVar3 = lVar3 + 4;
    } while (lVar1 << 2 != lVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string unparse_id(const Identifier *id)
{
    return encode_utf8(id->name);
}